

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_do_scrollbarh(nk_flags *state,nk_command_buffer *out,nk_rect scroll,int has_scrolling,
                      float offset,float target,float step,float button_pixel_inc,
                      nk_style_scrollbar *style,nk_input *in,nk_user_font *font)

{
  nk_rect bounds;
  nk_rect bounds_00;
  int iVar1;
  float fVar2;
  undefined8 uVar3;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  nk_rect button;
  float scroll_w;
  nk_flags ws;
  float scroll_ratio;
  float scroll_off;
  float scroll_offset;
  float scroll_step;
  nk_rect empty_east;
  nk_rect empty_west;
  nk_rect cursor;
  nk_user_font *font_local;
  nk_input *in_local;
  nk_style_scrollbar *style_local;
  float button_pixel_inc_local;
  float step_local;
  float target_local;
  float offset_local;
  int has_scrolling_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  float fStack_18;
  nk_rect scroll_local;
  
  scroll_local._0_8_ = scroll._8_8_;
  uVar3 = scroll._0_8_;
  unique0x10000415 = uVar3;
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x538a,
                  "float nk_do_scrollbarh(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_scrollbar *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x538b,
                  "float nk_do_scrollbarh(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if ((out == (nk_command_buffer *)0x0) || (style == (nk_style_scrollbar *)0x0)) {
    scroll_local.w = 0.0;
  }
  else {
    scroll_local.y = scroll.h;
    if (1.0 <= scroll_local.y) {
      local_bc = scroll_local.y;
    }
    else {
      local_bc = 1.0;
    }
    scroll_local.x = scroll.w;
    if (local_bc * 2.0 <= scroll_local.x) {
      local_c0 = scroll_local.x;
    }
    else {
      local_c0 = local_bc * 2.0;
    }
    scroll_local.x = local_c0;
    scroll_local.x = local_c0;
    scroll_local.y = local_bc;
    if (local_c0 < target) {
      step_local = offset;
      if (style->show_buttons != 0) {
        fStack_18 = scroll.y;
        fVar2 = fStack_18;
        button.x = local_bc;
        button.y = local_bc;
        button.w = local_c0 - (local_bc + local_bc);
        local_c4 = button_pixel_inc;
        if (step < button_pixel_inc) {
          local_c4 = step;
        }
        bounds.w = local_bc;
        bounds.x = (float)(int)uVar3;
        bounds.y = (float)(int)((ulong)uVar3 >> 0x20);
        bounds.h = local_bc;
        iVar1 = nk_do_button_symbol((nk_flags *)&button.h,out,bounds,style->dec_symbol,
                                    NK_BUTTON_REPEATER,&style->dec_button,in,font);
        if (iVar1 != 0) {
          step_local = offset - local_c4;
        }
        bounds_00.y = fVar2;
        bounds_00.x = (state_local._4_4_ + scroll_local.x) - button.x;
        bounds_00.w = button.x;
        bounds_00.h = button.y;
        iVar1 = nk_do_button_symbol((nk_flags *)&button.h,out,bounds_00,style->inc_symbol,
                                    NK_BUTTON_REPEATER,&style->inc_button,in,font);
        if (iVar1 != 0) {
          step_local = step_local + local_c4;
        }
        stack0xffffffffffffffe4 = CONCAT44(fStack_18,state_local._4_4_ + button.x);
        scroll_local.x = button.w;
      }
      local_c8 = step;
      if (scroll_local.x <= step) {
        local_c8 = scroll_local.x;
      }
      if (target - scroll_local.x <= step_local) {
        local_cc = target - scroll_local.x;
      }
      else {
        local_cc = step_local;
      }
      if (0.0 <= local_cc) {
        if (target - scroll_local.x <= step_local) {
          local_d4 = target - scroll_local.x;
        }
        else {
          local_d4 = step_local;
        }
        local_d0 = local_d4;
      }
      else {
        local_d0 = 0.0;
      }
      fVar2 = (scroll_local.x / target) * scroll_local.x +
              -(style->border + style->border + (style->padding).x * 2.0);
      empty_west.w = (local_d0 / target) * scroll_local.x + state_local._4_4_ + style->border +
                     (style->padding).x;
      empty_west.h = fStack_18 + style->border + (style->padding).y;
      empty_east.w = state_local._4_4_;
      empty_east.h = fStack_18;
      empty_west.x = empty_west.w - state_local._4_4_;
      empty_west.y = scroll_local.y;
      scroll_offset = empty_west.w + fVar2;
      scroll_step = fStack_18;
      empty_east.x = (state_local._4_4_ + scroll_local.x) - (empty_west.w + fVar2);
      empty_east.y = scroll_local.y;
      fVar2 = nk_scrollbar_behavior
                        (state,in,has_scrolling,(nk_rect *)((long)&state_local + 4),
                         (nk_rect *)&empty_west.w,(nk_rect *)&empty_east.w,(nk_rect *)&scroll_offset
                         ,local_d0,target,local_c8,NK_HORIZONTAL);
      empty_west.w = (fVar2 / target) * scroll_local.x + state_local._4_4_;
      if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      }
      nk_draw_scrollbar(out,*state,style,(nk_rect *)((long)&state_local + 4),
                        (nk_rect *)&empty_west.w);
      scroll_local.w = fVar2;
      if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
      }
    }
    else {
      scroll_local.w = 0.0;
    }
  }
  return scroll_local.w;
}

Assistant:

NK_LIB float
nk_do_scrollbarh(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect scroll, int has_scrolling,
    float offset, float target, float step, float button_pixel_inc,
    const struct nk_style_scrollbar *style, struct nk_input *in,
    const struct nk_user_font *font)
{
    struct nk_rect cursor;
    struct nk_rect empty_west;
    struct nk_rect empty_east;

    float scroll_step;
    float scroll_offset;
    float scroll_off;
    float scroll_ratio;

    NK_ASSERT(out);
    NK_ASSERT(style);
    if (!out || !style) return 0;

    /* scrollbar background */
    scroll.h = NK_MAX(scroll.h, 1);
    scroll.w = NK_MAX(scroll.w, 2 * scroll.h);
    if (target <= scroll.w) return 0;

    /* optional scrollbar buttons */
    if (style->show_buttons) {
        nk_flags ws;
        float scroll_w;
        struct nk_rect button;
        button.y = scroll.y;
        button.w = scroll.h;
        button.h = scroll.h;

        scroll_w = scroll.w - 2 * button.w;
        scroll_step = NK_MIN(step, button_pixel_inc);

        /* decrement button */
        button.x = scroll.x;
        if (nk_do_button_symbol(&ws, out, button, style->dec_symbol,
            NK_BUTTON_REPEATER, &style->dec_button, in, font))
            offset = offset - scroll_step;

        /* increment button */
        button.x = scroll.x + scroll.w - button.w;
        if (nk_do_button_symbol(&ws, out, button, style->inc_symbol,
            NK_BUTTON_REPEATER, &style->inc_button, in, font))
            offset = offset + scroll_step;

        scroll.x = scroll.x + button.w;
        scroll.w = scroll_w;
    }

    /* calculate scrollbar constants */
    scroll_step = NK_MIN(step, scroll.w);
    scroll_offset = NK_CLAMP(0, offset, target - scroll.w);
    scroll_ratio = scroll.w / target;
    scroll_off = scroll_offset / target;

    /* calculate cursor bounds */
    cursor.w = (scroll_ratio * scroll.w) - (2*style->border + 2*style->padding.x);
    cursor.x = scroll.x + (scroll_off * scroll.w) + style->border + style->padding.x;
    cursor.h = scroll.h - (2 * style->border + 2 * style->padding.y);
    cursor.y = scroll.y + style->border + style->padding.y;

    /* calculate empty space around cursor */
    empty_west.x = scroll.x;
    empty_west.y = scroll.y;
    empty_west.w = cursor.x - scroll.x;
    empty_west.h = scroll.h;

    empty_east.x = cursor.x + cursor.w;
    empty_east.y = scroll.y;
    empty_east.w = (scroll.x + scroll.w) - (cursor.x + cursor.w);
    empty_east.h = scroll.h;

    /* update scrollbar */
    scroll_offset = nk_scrollbar_behavior(state, in, has_scrolling, &scroll, &cursor,
        &empty_west, &empty_east, scroll_offset, target, scroll_step, NK_HORIZONTAL);
    scroll_off = scroll_offset / target;
    cursor.x = scroll.x + (scroll_off * scroll.w);

    /* draw scrollbar */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_scrollbar(out, *state, style, &scroll, &cursor);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return scroll_offset;
}